

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintExpressionContents::visitIf(PrintExpressionContents *this,If *curr)

{
  ostream *stream;
  undefined1 auVar1 [16];
  undefined8 in_RAX;
  Type TVar2;
  undefined8 uStack_28;
  
  stream = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"if",2);
  Colors::outputColorCode(stream,"\x1b[0m");
  TVar2.id = (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id;
  if (((curr->condition->type).id == 1) && (curr->ifFalse != (Expression *)0x0)) {
    TVar2 = wasm::Type::getLeastUpperBound((curr->ifTrue->type).id,(curr->ifFalse->type).id);
  }
  if (1 < TVar2.id) {
    uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = TVar2.id;
    PrintSExpression::printBlockType(this->parent,(Signature)(auVar1 << 0x40));
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    printMedium(o, "if");
    // Ifs are unreachable if their condition is unreachable, but in that case
    // the arms might have some concrete type we have to account for to produce
    // valid wat.
    auto type = curr->type;
    if (curr->condition->type == Type::unreachable && curr->ifFalse) {
      type = Type::getLeastUpperBound(curr->ifTrue->type, curr->ifFalse->type);
    }
    if (type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, type));
    }
  }